

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

uint64_t ReadCompactSize<ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>>
                   (ParamsStream<ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
                    *is,bool range_check)

{
  HashVerifier<DataStream> *pHVar1;
  ulong uVar2;
  char *pcVar3;
  size_t in_RCX;
  int __fd;
  long in_FS_OFFSET;
  uint8_t obj;
  byte local_38;
  undefined1 uStack_37;
  undefined2 uStack_36;
  int iStack_34;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pHVar1 = is->m_substream->m_substream;
  __fd = (int)&local_38;
  DataStream::read(pHVar1->m_source,__fd,(void *)0x1,in_RCX);
  CSHA256::Write((CSHA256 *)pHVar1,&local_38,1);
  uVar2 = (ulong)local_38;
  if (uVar2 < 0xfd) {
LAB_0085ab19:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return uVar2;
    }
  }
  else {
    if (uVar2 == 0xfe) {
      pHVar1 = is->m_substream->m_substream;
      DataStream::read(pHVar1->m_source,__fd,(void *)0x4,in_RCX);
      CSHA256::Write((CSHA256 *)pHVar1,&local_38,4);
      uVar2 = (ulong)CONCAT22(uStack_36,CONCAT11(uStack_37,local_38));
      if (uVar2 < 0x10000) {
        pcVar3 = (char *)__cxa_allocate_exception(0x20);
        local_30 = std::iostream_category();
        local_38 = 1;
        uStack_37 = 0;
        uStack_36 = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar3,(error_code *)"non-canonical ReadCompactSize()");
      }
      else {
LAB_0085ab09:
        if (!range_check || uVar2 < 0x2000001) goto LAB_0085ab19;
        pcVar3 = (char *)__cxa_allocate_exception(0x20);
        local_30 = std::iostream_category();
        local_38 = 1;
        uStack_37 = 0;
        uStack_36 = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar3,(error_code *)"ReadCompactSize(): size too large");
      }
    }
    else if (local_38 == 0xfd) {
      pHVar1 = is->m_substream->m_substream;
      DataStream::read(pHVar1->m_source,__fd,(void *)0x2,in_RCX);
      CSHA256::Write((CSHA256 *)pHVar1,&local_38,2);
      uVar2 = (ulong)CONCAT11(uStack_37,local_38);
      if (0xfc < uVar2) goto LAB_0085ab19;
      pcVar3 = (char *)__cxa_allocate_exception(0x20);
      local_30 = std::iostream_category();
      local_38 = 1;
      uStack_37 = 0;
      uStack_36 = 0;
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar3,(error_code *)"non-canonical ReadCompactSize()");
    }
    else {
      pHVar1 = is->m_substream->m_substream;
      DataStream::read(pHVar1->m_source,__fd,&DAT_00000008,in_RCX);
      CSHA256::Write((CSHA256 *)pHVar1,&local_38,8);
      uVar2 = CONCAT44(iStack_34,CONCAT22(uStack_36,CONCAT11(uStack_37,local_38)));
      if (iStack_34 != 0) goto LAB_0085ab09;
      pcVar3 = (char *)__cxa_allocate_exception(0x20);
      local_30 = std::iostream_category();
      local_38 = 1;
      uStack_37 = 0;
      uStack_36 = 0;
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar3,(error_code *)"non-canonical ReadCompactSize()");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

uint64_t ReadCompactSize(Stream& is, bool range_check = true)
{
    uint8_t chSize = ser_readdata8(is);
    uint64_t nSizeRet = 0;
    if (chSize < 253)
    {
        nSizeRet = chSize;
    }
    else if (chSize == 253)
    {
        nSizeRet = ser_readdata16(is);
        if (nSizeRet < 253)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else if (chSize == 254)
    {
        nSizeRet = ser_readdata32(is);
        if (nSizeRet < 0x10000u)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else
    {
        nSizeRet = ser_readdata64(is);
        if (nSizeRet < 0x100000000ULL)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    if (range_check && nSizeRet > MAX_SIZE) {
        throw std::ios_base::failure("ReadCompactSize(): size too large");
    }
    return nSizeRet;
}